

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<int>::GrowNoAnnotate
          (RepeatedField<int> *this,bool was_soo,int old_size,int new_size)

{
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 aVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  undefined8 *puVar3;
  int *__src;
  undefined8 uVar4;
  string *psVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  int capacity;
  int iVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  LogMessage local_48 [16];
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *local_38;
  
  iVar7 = 2;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar7 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar7 < new_size) {
    psVar5 = (string *)0x0;
  }
  else {
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)new_size,(long)iVar7,"new_size > old_capacity");
  }
  if (psVar5 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x4a2,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48)
    ;
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    aVar1.arena = internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    paVar2 = &heap_rep(this)->field_0;
    aVar1 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar2->arena;
  }
  capacity = 2;
  if (1 < new_size) {
    if (iVar7 < 0x3ffffffc) {
      if (iVar7 < 2 && iVar7 != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                   ,0x488,0x28,"capacity == 0 || capacity >= lower_limit");
        uVar4 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                          ((LogMessageFatal *)local_48);
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (uVar4,1," ");
        _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                  (uVar4);
        goto LAB_001a7d25;
      }
      iVar7 = iVar7 * 2 + 2;
      capacity = new_size;
      if (new_size < iVar7) {
        capacity = iVar7;
      }
    }
    else {
      capacity = 0x7fffffff;
    }
  }
  uVar8 = (ulong)capacity;
  uVar6 = uVar8 * 4;
  if (aVar1.arena == (Arena *)0x0) {
    if ((uVar8 & 0x3fffffff80000000) == 0) {
      psVar5 = (string *)0x0;
    }
    else {
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         (uVar8 & 0x3fffffffffffffff,0x7fffffff,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
    }
    if (psVar5 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                 ,0x4b1,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (local_48,(char (*) [59])
                          "Requested size is too large to fit element count into int.");
LAB_001a7d25:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_48);
    }
    uVar8 = uVar8 * 4 + 8;
    puVar3 = (undefined8 *)__tls_get_addr(&PTR_00524d90);
    if ((code *)*puVar3 == (code *)0x0) {
      paVar2 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)operator_new(uVar8);
    }
    else {
      auVar9 = (*(code *)*puVar3)(uVar8,puVar3[1]);
      paVar2 = auVar9._0_8_;
      uVar6 = auVar9._8_8_ - 8;
    }
    uVar6 = uVar6 >> 2;
    if (0x7ffffffe < uVar6) {
      uVar6 = 0x7fffffff;
    }
    capacity = (int)uVar6;
  }
  else {
    paVar2 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)
             google::protobuf::Arena::AllocateForArray((ulong)aVar1);
  }
  paVar2->arena = (Arena *)aVar1;
  if (0 < old_size) {
    local_38 = paVar2 + 1;
    __src = elements(this,was_soo);
    memcpy(local_38,__src,(ulong)(uint)old_size << 2);
  }
  if (!was_soo) {
    InternalDeallocate<false>(this);
  }
  internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,capacity,paVar2 + 1);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}